

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_reader.cc
# Opt level: O3

void __thiscall
pstack::Dwarf::DWARFReader::readForm(DWARFReader *this,Info *info,Unit *unit,Form form)

{
  Exception *this_00;
  Exception local_1e0;
  string local_40;
  
  if ((int)form < 0x1e) {
    if ((form != DW_FORM_string) && (form != DW_FORM_strp)) {
LAB_001425e2:
      this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset(&local_1e0,0,0x1a0);
      Exception::Exception(&local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e0.str,"unhandled form when reading form ",0x21);
      std::ostream::operator<<(&local_1e0.str,form);
      Exception::Exception(this_00,&local_1e0);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  }
  else {
    if (form == DW_FORM_data16) {
      this->off = this->off + 0x10;
      return;
    }
    if (form != DW_FORM_line_strp) goto LAB_001425e2;
  }
  readFormString_abi_cxx11_(&local_40,this,info,unit,form);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
DWARFReader::readForm(const Info &info, Unit &unit, Form form)
{
    switch (form) {
        case DW_FORM_string:
        case DW_FORM_line_strp:
        case DW_FORM_strp:
            readFormString(info, unit, form);
            break;
        case DW_FORM_data16:
            skip(16); // line info uses this for LNCT_MD5
            return;

        default:
            throw (Exception() << "unhandled form when reading form " << form);
    }
}